

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmpEstimation.cpp
# Opt level: O0

Vector computeZmp(Vector *forces,Matrix *sensorPosition1,Matrix *sensorPosition2,uint contactNbr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Index IVar6;
  Scalar *pSVar7;
  CoeffReturnType pdVar8;
  Scalar *pSVar9;
  undefined4 in_register_0000000c;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index extraout_RDX_01;
  Index IVar10;
  Index extraout_RDX_02;
  uint in_R8D;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector VVar14;
  Scalar local_110;
  double local_108;
  double My;
  double Mx;
  double fz;
  double fy;
  double fx;
  Matrix M;
  Scalar local_c0;
  Type local_b8;
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_70;
  Vector *f;
  uint i;
  byte local_51;
  double local_50;
  double sumZmpz;
  double sumZmpy;
  double sumZmpx;
  double fnormal;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_28;
  uint contactNbr_local;
  Matrix *sensorPosition2_local;
  Matrix *sensorPosition1_local;
  Vector *forces_local;
  Vector *zmp;
  
  pMStack_28 = (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(in_register_0000000c,contactNbr);
  sumZmpx = 0.0;
  sumZmpy = 0.0;
  sumZmpz = 0.0;
  local_50 = 0.0;
  local_51 = 0;
  fnormal._4_4_ = in_R8D;
  sensorPosition2_local = sensorPosition2;
  sensorPosition1_local = sensorPosition1;
  forces_local = forces;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(forces);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,3);
  for (f._0_4_ = 0; (uint)f < fnormal._4_4_; f._0_4_ = (uint)f + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<int,int>
              (&local_b8,(DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)sensorPosition1_local,
               (ulong)((uint)f * 6),0,6,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_80,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
               &local_b8);
    local_70 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80;
    IVar6 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(local_70);
    if (IVar6 == 6) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&fx);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&fx,4,4);
      if ((uint)f == 0) {
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&fx,sensorPosition2_local);
      }
      if ((uint)f == 1) {
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&fx,pMStack_28);
      }
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,0,0);
      dVar13 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,0);
      dVar1 = *pdVar8;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,0,1);
      dVar2 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,1);
      dVar3 = *pdVar8;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,0,2);
      dVar4 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,2);
      fy = dVar4 * *pdVar8 + dVar13 * dVar1 + dVar2 * dVar3;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,1,0);
      dVar13 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,0);
      dVar1 = *pdVar8;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,1,1);
      dVar2 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,1);
      dVar3 = *pdVar8;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,1,2);
      dVar4 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,2);
      fz = dVar4 * *pdVar8 + dVar13 * dVar1 + dVar2 * dVar3;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,2,0);
      dVar13 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,0);
      dVar1 = *pdVar8;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,2,1);
      dVar2 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,1);
      dVar3 = *pdVar8;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,2,2);
      dVar4 = *pSVar7;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,2);
      Mx = dVar4 * *pdVar8 + dVar13 * dVar1 + dVar2 * dVar3;
      if (0.0 < Mx) {
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,0,0)
        ;
        dVar13 = *pSVar7;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,3
                           );
        dVar1 = *pdVar8;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,0,1)
        ;
        dVar2 = *pSVar7;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,4
                           );
        dVar3 = *pdVar8;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,0,2)
        ;
        dVar4 = *pSVar7;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,5
                           );
        dVar5 = *pdVar8;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,1,3)
        ;
        dVar11 = *pSVar7 * Mx;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,2,3)
        ;
        My = (dVar11 + dVar4 * dVar5 + dVar13 * dVar1 + dVar2 * dVar3) - *pSVar7 * fz;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,1,0)
        ;
        dVar13 = *pSVar7;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,3
                           );
        dVar1 = *pdVar8;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,1,1)
        ;
        dVar2 = *pSVar7;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,4
                           );
        dVar3 = *pdVar8;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,1,2)
        ;
        dVar4 = *pSVar7;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_70,5
                           );
        dVar5 = *pdVar8;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,2,3)
        ;
        dVar12 = *pSVar7 * fy;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,0,3)
        ;
        dVar11 = Mx;
        local_108 = (dVar12 + dVar4 * dVar5 + dVar13 * dVar1 + dVar2 * dVar3) - *pSVar7 * Mx;
        sumZmpx = sumZmpx + Mx;
        sumZmpy = sumZmpy - local_108;
        sumZmpz = sumZmpz + My;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&fx,2,3)
        ;
        local_50 = dVar11 * *pSVar7 + local_50;
      }
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&fx);
      M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ = 0;
    }
    else {
      local_c0 = 0.0;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)forces,&local_c0);
      local_51 = 1;
      M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ = 1;
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_80);
    IVar10 = extraout_RDX;
    if (M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ !=
        0) goto LAB_00104228;
  }
  if ((sumZmpx != 0.0) || (NAN(sumZmpx))) {
    dVar13 = sumZmpy / sumZmpx;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)forces,0);
    *pSVar9 = dVar13;
    dVar13 = sumZmpz / sumZmpx;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)forces,1);
    *pSVar9 = dVar13;
    dVar13 = local_50 / sumZmpx;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)forces,2);
    *pSVar9 = dVar13;
    IVar10 = extraout_RDX_00;
  }
  else {
    local_110 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)forces,&local_110);
    IVar10 = extraout_RDX_01;
  }
  local_51 = 1;
  M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ = 1;
LAB_00104228:
  if ((local_51 & 1) == 0) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(forces);
    IVar10 = extraout_RDX_02;
  }
  VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar10;
  VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)forces;
  return (Vector)VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector computeZmp(Vector & forces, Matrix & sensorPosition1, Matrix & sensorPosition2, unsigned contactNbr)
{
  double fnormal = 0;
  double sumZmpx = 0;
  double sumZmpy = 0;
  double sumZmpz = 0;
  Vector zmp;
  zmp.resize(3);

  for(unsigned int i = 0; i < contactNbr; ++i)
  {
    const Vector & f = forces.block(i * 6, 0, 6, 1);
    // Check that force is of dimension 6
    if(f.size() != 6)
    {
      zmp.fill(0.);
      return zmp;
    }

    Matrix M;
    M.resize(4, 4);
    if(i == 0)
    {
      M = sensorPosition1;
    }
    if(i == 1)
    {
      M = sensorPosition2;
    }

    double fx = M(0, 0) * f(0) + M(0, 1) * f(1) + M(0, 2) * f(2);
    double fy = M(1, 0) * f(0) + M(1, 1) * f(1) + M(1, 2) * f(2);
    double fz = M(2, 0) * f(0) + M(2, 1) * f(1) + M(2, 2) * f(2);

    if(fz > 0)
    {
      double Mx = M(0, 0) * f(3) + M(0, 1) * f(4) + M(0, 2) * f(5) + M(1, 3) * fz - M(2, 3) * fy;
      double My = M(1, 0) * f(3) + M(1, 1) * f(4) + M(1, 2) * f(5) + M(2, 3) * fx - M(0, 3) * fz;
      fnormal += fz;
      sumZmpx -= My;
      sumZmpy += Mx;
      sumZmpz += fz * M(2, 3);
    }
  }
  if(fnormal != 0)
  {
    zmp(0) = sumZmpx / fnormal;
    zmp(1) = sumZmpy / fnormal;
    zmp(2) = sumZmpz / fnormal;
  }
  else
  {
    zmp.fill(0.);
  }
  return zmp;
}